

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O1

string * __thiscall
toml::concat_to_string<char_const(&)[33],toml::value_t>
          (string *__return_storage_ptr__,toml *this,char (*args) [33],value_t *args_1)

{
  uint *puVar1;
  value_t *in_R8;
  ostringstream oss;
  long local_198 [3];
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xfffffefb | 4;
  detail::concat_to_string_impl<char_const(&)[33],toml::value_t>
            (__return_storage_ptr__,(detail *)local_198,(ostringstream *)this,args,in_R8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string concat_to_string(Ts&& ... args)
{
    std::ostringstream oss;
    oss << std::boolalpha << std::fixed;
    return detail::concat_to_string_impl(oss, std::forward<Ts>(args) ...);
}